

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O0

IterateResult __thiscall
gl4cts::DirectStateAccess::VertexArrays::GetVertexArrayIndexedErrorsTest::iterate
          (GetVertexArrayIndexedErrorsTest *this)

{
  bool bVar1;
  char cVar2;
  bool bVar3;
  int iVar4;
  deUint32 err;
  RenderContext *pRVar5;
  undefined4 extraout_var;
  ContextInfo *this_00;
  GLuint i;
  bool is_accepted_pname;
  undefined8 uStack_48;
  GLenum bad_pname;
  GLint64 storage64;
  int local_38;
  GLint storage;
  GLuint not_a_vao;
  GLuint vao;
  bool is_error;
  bool is_ok;
  ApiType AStack_28;
  bool is_arb_direct_state_access;
  byte local_21;
  long lStack_20;
  bool is_at_least_gl_45;
  Functions *gl;
  GetVertexArrayIndexedErrorsTest *this_local;
  
  gl = (Functions *)this;
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  iVar4 = (*pRVar5->_vptr_RenderContext[3])();
  lStack_20 = CONCAT44(extraout_var,iVar4);
  pRVar5 = deqp::Context::getRenderContext((this->super_TestCase).m_context);
  AStack_28.m_bits = (*pRVar5->_vptr_RenderContext[2])();
  vao = (GLuint)glu::ApiType::core(4,5);
  local_21 = glu::contextSupports((ContextType)AStack_28.m_bits,(ApiType)vao);
  this_00 = deqp::Context::getContextInfo((this->super_TestCase).m_context);
  not_a_vao._3_1_ = glu::ContextInfo::isExtensionSupported(this_00,"GL_ARB_direct_state_access");
  if (((local_21 & 1) != 0) || ((bool)not_a_vao._3_1_)) {
    not_a_vao._2_1_ = 1;
    not_a_vao._1_1_ = 0;
    storage = 0;
    local_38 = 0;
    storage64._4_4_ = 0;
    uStack_48 = 0;
    i = 0;
    bVar3 = true;
LAB_01215c00:
    if (bVar3) {
      i = i + 1;
      bVar3 = false;
      bVar1 = false;
      while (!bVar1) {
        if (i == 0x8622) {
          bVar3 = true;
          break;
        }
        bVar1 = true;
      }
      goto LAB_01215c00;
    }
    (**(code **)(lStack_20 + 0x410))(1,&storage);
    err = (**(code **)(lStack_20 + 0x800))();
    glu::checkError(err,"glCreateVertexArrays call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x157b);
    do {
      local_38 = local_38 + 1;
      cVar2 = (**(code **)(lStack_20 + 0xcd8))();
    } while (cVar2 != '\0');
    (**(code **)(lStack_20 + 0xb80))(local_38,0,0x8622,(long)&storage64 + 4);
    bVar3 = CheckError(this,0x502,
                       "INVALID_OPERATION error was not generated by GetVertexArrayIndexediv if vaobj is not the name of an existing vertex array object."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0xb78))(local_38,0,0x82d7,&stack0xffffffffffffffb8);
    bVar3 = CheckError(this,0x502,
                       "INVALID_OPERATION error was not generated by GetVertexArrayIndexed64iv if vaobj is not the name of an existing vertex array object."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0xb80))(storage,0,i,(long)&storage64 + 4);
    bVar3 = CheckError(this,0x500,
                       "INVALID_ENUM error was not generated by GetVertexArrayIndexediv if pname is not one of the valid values."
                      );
    not_a_vao._2_1_ = bVar3 & not_a_vao._2_1_;
    (**(code **)(lStack_20 + 0xb78))(storage,0,0x82d8,&stack0xffffffffffffffb8);
    bVar3 = CheckError(this,0x500,
                       "INVALID_ENUM error was not generated by GetVertexArrayIndexed64iv if pname is not VERTEX_BINDING_OFFSET."
                      );
    not_a_vao._2_1_ = (not_a_vao._2_1_ & 1 & bVar3) != 0;
    if (storage != 0) {
      (**(code **)(lStack_20 + 0x490))(1);
    }
    do {
      iVar4 = (**(code **)(lStack_20 + 0x800))();
    } while (iVar4 != 0);
    if ((not_a_vao._2_1_ & 1) == 0) {
      if ((not_a_vao._1_1_ & 1) == 0) {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_FAIL,"Fail");
      }
      else {
        tcu::TestContext::setTestResult
                  ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
                   QP_TEST_RESULT_INTERNAL_ERROR,"Error");
      }
    }
    else {
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
    }
  }
  else {
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,
               QP_TEST_RESULT_NOT_SUPPORTED,"Not Supported");
  }
  return STOP;
}

Assistant:

tcu::TestNode::IterateResult GetVertexArrayIndexedErrorsTest::iterate()
{
	/* Shortcut for GL functionality. */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* Get context setup. */
	bool is_at_least_gl_45 = (glu::contextSupports(m_context.getRenderContext().getType(), glu::ApiType::core(4, 5)));
	bool is_arb_direct_state_access = m_context.getContextInfo().isExtensionSupported("GL_ARB_direct_state_access");

	if ((!is_at_least_gl_45) && (!is_arb_direct_state_access))
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_NOT_SUPPORTED, "Not Supported");

		return STOP;
	}

	/* Running tests. */
	bool is_ok	= true;
	bool is_error = false;

	/* Tested Objects. */
	glw::GLuint vao		  = 0;
	glw::GLuint not_a_vao = 0;

	/* Dummy storage. */
	glw::GLint   storage   = 0;
	glw::GLint64 storage64 = 0;

	/* Bad parameter setup. */
	glw::GLenum bad_pname = 0;

	static const glw::GLenum accepted_pnames[] = { GL_VERTEX_ATTRIB_ARRAY_ENABLED,	GL_VERTEX_ATTRIB_ARRAY_SIZE,
												   GL_VERTEX_ATTRIB_ARRAY_STRIDE,	 GL_VERTEX_ATTRIB_ARRAY_TYPE,
												   GL_VERTEX_ATTRIB_ARRAY_NORMALIZED, GL_VERTEX_ATTRIB_ARRAY_INTEGER,
												   GL_VERTEX_ATTRIB_ARRAY_LONG,		  GL_VERTEX_ATTRIB_ARRAY_DIVISOR,
												   GL_VERTEX_ATTRIB_RELATIVE_OFFSET };

	{
		bool is_accepted_pname = true;
		while (is_accepted_pname)
		{
			bad_pname++;
			is_accepted_pname = false;
			for (glw::GLuint i = 0; i < sizeof(accepted_pnames) / sizeof(accepted_pnames); ++i)
			{
				if (accepted_pnames[i] == bad_pname)
				{
					is_accepted_pname = true;
					break;
				}
			}
		}
	}

	try
	{
		/* Prepare valid Objects. */
		gl.createVertexArrays(1, &vao);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glCreateVertexArrays call failed.");

		/* Prepare invalid VAO. */
		while (gl.isVertexArray(++not_a_vao))
			;

		/* Not a VAO. */
		gl.getVertexArrayIndexediv(not_a_vao, 0, GL_VERTEX_ATTRIB_ARRAY_ENABLED, &storage);

		is_ok &=
			CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION error was not generated by GetVertexArrayIndexediv if "
											 "vaobj is not the name of an existing vertex array object.");

		gl.getVertexArrayIndexed64iv(not_a_vao, 0, GL_VERTEX_BINDING_OFFSET, &storage64);

		is_ok &=
			CheckError(GL_INVALID_OPERATION, "INVALID_OPERATION error was not generated by GetVertexArrayIndexed64iv "
											 "if vaobj is not the name of an existing vertex array object.");

		/* Bad parameter. */
		gl.getVertexArrayIndexediv(vao, 0, bad_pname, &storage);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM error was not generated by GetVertexArrayIndexediv if pname is not one of the valid values.");

		/* Bad parameter 64. */
		gl.getVertexArrayIndexed64iv(vao, 0, GL_VERTEX_BINDING_OFFSET + 1, &storage64);

		is_ok &= CheckError(
			GL_INVALID_ENUM,
			"INVALID_ENUM error was not generated by GetVertexArrayIndexed64iv if pname is not VERTEX_BINDING_OFFSET.");
	}
	catch (...)
	{
		is_ok	= false;
		is_error = true;
	}

	/* Clean up. */
	if (vao)
	{
		gl.deleteVertexArrays(1, &vao);
	}

	/* Errors clean up. */
	while (gl.getError())
		;

	/* Result's setup. */
	if (is_ok)
	{
		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	}
	else
	{
		if (is_error)
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_INTERNAL_ERROR, "Error");
		}
		else
		{
			m_testCtx.setTestResult(QP_TEST_RESULT_FAIL, "Fail");
		}
	}

	return STOP;
}